

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayref.h
# Opt level: O1

void __thiscall
mp::ArrayRef<char_const*>::init_from_rvalue<mp::ArrayRef<char_const*>>
          (ArrayRef<char_const*> *this,ArrayRef<const_char_*> *other)

{
  size_t sVar1;
  
  if ((other->save_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (other->save_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    *(char ***)(this + 0x18) = other->data_;
    sVar1 = other->size_;
  }
  else {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::_M_move_assign
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)this);
    *(long *)(this + 0x18) = *(long *)this;
    sVar1 = *(long *)(this + 8) - *(long *)this >> 3;
  }
  *(size_t *)(this + 0x20) = sVar1;
  return;
}

Assistant:

void init_from_rvalue(AR&& other) noexcept {
      if (other.save_.size()) {
        save_ = std::move(other.save_);
        data_ = save_.data();
        size_ = save_.size();
      }
      else {
        data_ = other.data();
        size_ = other.size();
      }
    }